

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

int Llb_Nonlin4CoreReach(Aig_Man_t *pAig,Gia_ParLlb_t *pPars)

{
  int iVar1;
  int iVar2;
  Llb_Mnx_t *p;
  long lVar3;
  long lVar4;
  timespec ts;
  timespec local_30;
  
  if (pPars->fVerbose != 0) {
    Aig_ManPrintStats(pAig);
  }
  if ((pPars->fCluster == 0) || (pAig->vObjs->nSize - pAig->nDeleted < 0x8000)) {
    iVar1 = clock_gettime(3,&local_30);
    if (iVar1 < 0) {
      lVar3 = 1;
    }
    else {
      lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
      lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_30.tv_sec * -1000000;
    }
    p = Llb_MnxStart(pAig,pPars);
    iVar1 = -1;
    if (pPars->fSkipReach == 0) {
      iVar1 = Llb_Nonlin4Reachability(p);
    }
    iVar2 = clock_gettime(3,&local_30);
    if (iVar2 < 0) {
      lVar4 = -1;
    }
    else {
      lVar4 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
    }
    p->timeTotal = lVar4 + lVar3;
    Llb_MnxStop(p);
  }
  else {
    puts("The number of objects is more than 2^15.  Clustering cannot be used.");
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int Llb_Nonlin4CoreReach( Aig_Man_t * pAig, Gia_ParLlb_t * pPars )
{
    Llb_Mnx_t * pMnn;
    int RetValue = -1;
    if ( pPars->fVerbose )
    Aig_ManPrintStats( pAig );
    if ( pPars->fCluster && Aig_ManObjNum(pAig) >= (1 << 15) )
    {
        printf( "The number of objects is more than 2^15.  Clustering cannot be used.\n" );
        return RetValue;
    }
    {
        abctime clk = Abc_Clock();
        pMnn = Llb_MnxStart( pAig, pPars );
//Llb_MnxCheckNextStateVars( pMnn );
        if ( !pPars->fSkipReach )
            RetValue = Llb_Nonlin4Reachability( pMnn );
        pMnn->timeTotal = Abc_Clock() - clk;
        Llb_MnxStop( pMnn );
    }
    return RetValue;
}